

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_stream_socket.c
# Opt level: O2

int oonf_stream_apply_managed(oonf_stream_managed *managed,oonf_stream_managed_config *config)

{
  int iVar1;
  char *__s1;
  bool bVar2;
  
  __s1 = config->interface;
  iVar1 = strcmp(__s1,(managed->_managed_config).interface);
  bVar2 = true;
  if ((iVar1 == 0) && ((managed->_if_listener)._node.next != (list_entity *)0x0)) {
    bVar2 = (managed->_if_listener)._node.prev == (list_entity *)0x0;
  }
  oonf_stream_copy_managed_config(&managed->_managed_config,config);
  if ((managed->config).memcookie == (oonf_class *)0x0) {
    (managed->config).memcookie = &_connection_cookie;
  }
  (managed->socket_v4).managed = managed;
  (managed->socket_v6).managed = managed;
  if (bVar2) {
    os_interface_linux_remove(&managed->_if_listener);
    os_interface_linux_add(&managed->_if_listener);
  }
  if (((&log_global_mask)[_oonf_stream_socket_subsystem.logging] & 1) != 0) {
    if (config->interface[0] == '\0') {
      __s1 = "any";
    }
    oonf_log(1,(ulong)_oonf_stream_socket_subsystem.logging,"src/base/oonf_stream_socket.c",0x183,0,
             0,"Apply changes for managed socket (if %s) with port %d",__s1,config->port);
  }
  iVar1 = _apply_managed(managed);
  if (iVar1 != 0) {
    os_interface_linux_trigger_handler(&managed->_if_listener);
  }
  return iVar1;
}

Assistant:

int
oonf_stream_apply_managed(struct oonf_stream_managed *managed, struct oonf_stream_managed_config *config) {
  bool if_changed;
  int result;

  if_changed = strcmp(config->interface, managed->_managed_config.interface) != 0 ||
               !list_is_node_added(&managed->_if_listener._node);

  oonf_stream_copy_managed_config(&managed->_managed_config, config);

  if (managed->config.memcookie == NULL) {
    managed->config.memcookie = &_connection_cookie;
  }

  /* set back pointers */
  managed->socket_v4.managed = managed;
  managed->socket_v6.managed = managed;

  /* handle change in interface listener */
  if (if_changed) {
    /* interface changed, remove old listener if necessary */
    os_interface_remove(&managed->_if_listener);

    /* create new interface listener */
    os_interface_add(&managed->_if_listener);
  }

  OONF_DEBUG(LOG_STREAM, "Apply changes for managed socket (if %s) with port %d",
    config->interface == NULL || config->interface[0] == 0 ? "any" : config->interface, config->port);

  result = _apply_managed(managed);
  if (result) {
    /* did not work, trigger interface handler to try later again */
    os_interface_trigger_handler(&managed->_if_listener);
  }
  return result;
}